

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

void __thiscall Fl_Tree_Item::Fl_Tree_Item(Fl_Tree_Item *this,Fl_Tree_Prefs *prefs)

{
  Fl_Tree_Prefs *prefs_local;
  Fl_Tree_Item *this_local;
  
  Fl_Tree_Item_Array::Fl_Tree_Item_Array(&this->_children,10);
  _Init(this,prefs,(Fl_Tree *)0x0);
  return;
}

Assistant:

Fl_Tree_Item::Fl_Tree_Item(const Fl_Tree_Prefs &prefs) {
  _Init(prefs, 0);
}